

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QWidget * __thiscall QWidget::grab(QWidget *this,QRect *rectangle)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  undefined1 auVar2 [16];
  char cVar3;
  undefined8 *in_RDX;
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  double dVar4;
  QSize local_60;
  QRect local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&rectangle->x2;
  if ((this_00->high_attributes[0] & 0x10000008) != 0x10000000) {
    sendResizeEvents((QWidget *)rectangle);
  }
  uVar1 = *(uint *)&this_00->field_0x250;
  local_58._0_8_ = *in_RDX;
  local_58._8_8_ = in_RDX[1];
  if (((local_58.x2.m_i - local_58.x1.m_i) + 1 < 0) || ((local_58.y2.m_i - local_58.y1.m_i) + 1 < 0)
     ) {
    QRegion::QRegion((QRegion *)&local_60);
    QWidgetPrivate::prepareToRender
              ((QWidgetPrivate *)local_48,(QRegion *)this_00,
               (QFlagsStorageHelper<QWidget::RenderFlag,_4>)SUB84(&local_60,0));
    QRegion::boundingRect();
    local_58._8_8_ = extraout_RDX;
    QRegion::~QRegion((QRegion *)local_48);
    QRegion::~QRegion((QRegion *)&local_60);
    local_58._0_8_ = *in_RDX;
  }
  local_48 = (undefined1  [16])rect((QWidget *)rectangle);
  cVar3 = QRect::intersects(&local_58);
  if (cVar3 == '\0') {
    QPixmap::QPixmap((QPixmap *)this);
  }
  else {
    dVar4 = (double)QPaintDevice::devicePixelRatio();
    *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&this->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&this->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = dVar4 * (double)((local_58.x2.m_i - local_58.x1.m_i) + 1);
    local_48._8_8_ = dVar4 * (double)((local_58.y2.m_i - local_58.y1.m_i) + 1);
    local_60 = QSizeF::toSize((QSizeF *)local_48);
    QPixmap::QPixmap((QPixmap *)this,&local_60);
    QPixmap::setDevicePixelRatio(dVar4);
    if ((this_00->field_0x252 & 2) == 0) {
      QColor::QColor((QColor *)local_48,transparent);
      QPixmap::fill((QColor *)this);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_48._8_8_;
    local_48 = auVar2 << 0x40;
    QRegion::QRegion((QRegion *)&local_60,&local_58,Rectangle);
    QWidgetPrivate::render
              (this_00,(QPaintDevice *)this,(QPoint *)local_48,(QRegion *)&local_60,(RenderFlags)0x7
              );
    QRegion::~QRegion((QRegion *)&local_60);
    *(uint *)&this_00->field_0x250 = *(uint *)&this_00->field_0x250 & 0xfffeffff | uVar1 & 0x10000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QWidget::grab(const QRect &rectangle)
{
    Q_D(QWidget);
    if (testAttribute(Qt::WA_PendingResizeEvent) || !testAttribute(Qt::WA_WState_Created))
        sendResizeEvents(this);

    const QWidget::RenderFlags renderFlags = QWidget::DrawWindowBackground | QWidget::DrawChildren | QWidget::IgnoreMask;

    const bool oldDirtyOpaqueChildren =  d->dirtyOpaqueChildren;
    QRect r(rectangle);
    if (r.width() < 0 || r.height() < 0) {
        // For grabbing widgets that haven't been shown yet,
        // we trigger the layouting mechanism to determine the widget's size.
        r = d->prepareToRender(QRegion(), renderFlags).boundingRect();
        r.setTopLeft(rectangle.topLeft());
    }

    if (!r.intersects(rect()))
        return QPixmap();

    const qreal dpr = devicePixelRatio();
    QPixmap res((QSizeF(r.size()) * dpr).toSize());
    res.setDevicePixelRatio(dpr);
    if (!d->isOpaque)
        res.fill(Qt::transparent);
    d->render(&res, QPoint(), QRegion(r), renderFlags);

    d->dirtyOpaqueChildren = oldDirtyOpaqueChildren;
    return res;
}